

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O2

uint32_t helper_neon_qshl_s32_arm(CPUARMState *env,uint32_t arg1,uint32_t arg2)

{
  uint32_t uVar1;
  byte bVar2;
  neon_s32 vsrc2;
  neon_s32 vsrc1;
  
  bVar2 = (byte)arg2;
  if ((char)bVar2 < ' ') {
    if ((char)bVar2 < -0x1f) {
      return (int)arg1 >> 0x1f;
    }
    if ((char)bVar2 < '\0') {
      return (int)arg1 >> (-bVar2 & 0x1f);
    }
    uVar1 = arg1 << (bVar2 & 0x1f);
    if ((int)uVar1 >> (bVar2 & 0x1f) == arg1) {
      return uVar1;
    }
    (env->vfp).qc[0] = 1;
  }
  else {
    if (arg1 == 0) {
      return 0;
    }
    (env->vfp).qc[0] = 1;
  }
  return ((int)arg1 < 1) + 0x7fffffff;
}

Assistant:

uint64_t HELPER(neon_qshl_s64)(CPUARMState *env, uint64_t valop, uint64_t shiftop)
{
    int8_t shift = (uint8_t)shiftop;
    int64_t val = valop;
    if (shift >= 64) {
        if (val) {
            SET_QC();
            val = (val >> 63) ^ ~SIGNBIT64;
        }
    } else if (shift <= -64) {
        val >>= 63;
    } else if (shift < 0) {
        val >>= -shift;
    } else {
        int64_t tmp = val;
        val <<= shift;
        if ((val >> shift) != tmp) {
            SET_QC();
            val = (tmp >> 63) ^ ~SIGNBIT64;
        }
    }
    return val;
}